

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void __thiscall Analysis::FlowAnalysis(Analysis *this)

{
  shared_ptr<RandomUtil::Random> *psVar1;
  shared_ptr<particleSamples> *psVar2;
  pointer ppsVar3;
  bool bVar4;
  singleParticleSpectra *psVar5;
  singleParticleSpectra **ipart;
  pointer ppsVar6;
  string *this_00;
  ostream *this_01;
  double dVar7;
  double dVar8;
  ParameterReader paraRdr;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  singleParticleSpectra *local_1760;
  ParameterReader local_1758;
  _Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> local_1728;
  double local_1708;
  int local_16fc;
  ostream *local_16f8;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_16f0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_16e0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_16d0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_16c0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_16b0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_16a0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1690;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1680;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1670;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1660;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1650;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1640;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1630;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1620;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1610;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1600;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_15f0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_15e0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_15d0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_15c0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_15b0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_15a0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1590;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1580;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1570;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1560;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1550;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1540;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1530;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1520;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1510;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1500;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_14f0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_14e0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_14d0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_14c0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_14b0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_14a0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1490;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1480;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1470;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1460;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_1450;
  __shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2> local_1440;
  string local_1430;
  string local_1410;
  string local_13f0;
  string local_13d0;
  string local_13b0;
  string local_1390;
  string local_1370;
  string local_1350;
  string local_1330;
  string local_1310;
  string local_12f0;
  string local_12d0;
  string local_12b0;
  string local_1290;
  string local_1270;
  string local_1250;
  string local_1230;
  string local_1210;
  string local_11f0;
  string local_11d0;
  string local_11b0;
  string local_1190;
  string local_1170;
  string local_1150;
  string local_1130;
  string local_1110;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  string local_1030;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParameterReader::ParameterReader(&local_1758,&this->paraRdr_);
  std::__cxx11::string::string((string *)&local_d0,"compute_correlation",(allocator *)&local_1728);
  dVar7 = ParameterReader::getVal(&local_1758,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((int)dVar7 == 1) {
    std::__cxx11::string::string((string *)&local_f0,"compute_correlation",(allocator *)&local_1728)
    ;
    ParameterReader::setVal(&local_1758,&local_f0,0.0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"flag_charge_dependence",(allocator *)&local_1728);
  dVar8 = ParameterReader::getVal(&local_1758,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if ((int)dVar8 == 1) {
    std::__cxx11::string::string
              ((string *)&local_130,"flag_charge_dependence",(allocator *)&local_1728);
    ParameterReader::setVal(&local_1758,&local_130,0.0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  local_1728._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1728._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1728._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_150,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_150,99999.0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_170,"rap_type",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_170,0.0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string
            ((string *)&local_190,"rapidity_distribution",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_190,1.0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string
            ((string *)&local_1b0,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_1b0,0.0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string
            ((string *)&local_1d0,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_1d0,4.0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string
            ((string *)&local_1f0,"rapidityPTDistributionFlag",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_1f0,1.0);
  std::__cxx11::string::~string((string *)&local_1f0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  local_16fc = (int)dVar8;
  std::__cxx11::string::string((string *)&local_210,(string *)this);
  psVar1 = &this->ran_gen_ptr_;
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1450,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_210,(shared_ptr<RandomUtil::Random> *)&local_1450);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1450._M_refcount);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_230,9999.0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"rap_type",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_250,0.0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string
            ((string *)&local_270,"rapidity_distribution",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_270,1.0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string
            ((string *)&local_290,"rapidityPTDistributionFlag",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_290,0.0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_2b0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_2b0,-0.5);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_2d0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_2d0,0.5);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string
            ((string *)&local_2f0,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_2f0,0.15);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string
            ((string *)&local_310,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_310,2.0);
  std::__cxx11::string::~string((string *)&local_310);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_330,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1460,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_330,(shared_ptr<RandomUtil::Random> *)&local_1460);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1460._M_refcount);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string
            ((string *)&local_350,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_350,0.2);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string
            ((string *)&local_370,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_370,3.0);
  std::__cxx11::string::~string((string *)&local_370);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_390,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1470,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_390,(shared_ptr<RandomUtil::Random> *)&local_1470);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1470._M_refcount);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_3b0,-1.0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3d0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_3d0,-0.5);
  std::__cxx11::string::~string((string *)&local_3d0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_3f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1480,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_3f0,(shared_ptr<RandomUtil::Random> *)&local_1480);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1480._M_refcount);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string((string *)&local_410,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_410,0.5);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_430,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_430,1.0);
  std::__cxx11::string::~string((string *)&local_430);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_450,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1490,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_450,(shared_ptr<RandomUtil::Random> *)&local_1490);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1490._M_refcount);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string((string *)&local_470,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_470,-1.0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string((string *)&local_490,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_490,1.0);
  std::__cxx11::string::~string((string *)&local_490);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_4b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14a0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_4b0,(shared_ptr<RandomUtil::Random> *)&local_14a0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_14a0._M_refcount);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string((string *)&local_4d0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_4d0,-0.8);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::string((string *)&local_4f0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_4f0,0.8);
  std::__cxx11::string::~string((string *)&local_4f0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_510,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14b0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_510,(shared_ptr<RandomUtil::Random> *)&local_14b0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_14b0._M_refcount);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::string
            ((string *)&local_530,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_530,0.4);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::string
            ((string *)&local_550,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_550,4.0);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::string((string *)&local_570,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_570,-1.0);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::string((string *)&local_590,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_590,1.0);
  std::__cxx11::string::~string((string *)&local_590);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_5b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14c0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_5b0,(shared_ptr<RandomUtil::Random> *)&local_14c0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_14c0._M_refcount);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::string
            ((string *)&local_5d0,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_5d0,0.3);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::string
            ((string *)&local_5f0,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_5f0,3.0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::string((string *)&local_610,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_610,-2.4);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::string((string *)&local_630,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_630,2.4);
  std::__cxx11::string::~string((string *)&local_630);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_650,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14d0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_650,(shared_ptr<RandomUtil::Random> *)&local_14d0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_14d0._M_refcount);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::string
            ((string *)&local_670,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_670,0.4);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::string
            ((string *)&local_690,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_690,2.0);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::string((string *)&local_6b0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_6b0,-2.5);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::string((string *)&local_6d0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_6d0,2.5);
  std::__cxx11::string::~string((string *)&local_6d0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_6f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14e0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_6f0,(shared_ptr<RandomUtil::Random> *)&local_14e0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_14e0._M_refcount);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::string
            ((string *)&local_710,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_710,0.5);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::string
            ((string *)&local_730,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_730,5.0);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string((string *)&local_750,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_750,-2.5);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::string((string *)&local_770,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_770,2.5);
  std::__cxx11::string::~string((string *)&local_770);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_790,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14f0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_790,(shared_ptr<RandomUtil::Random> *)&local_14f0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_14f0._M_refcount);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::string((string *)&local_7b0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_7b0,0.5);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::string((string *)&local_7d0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_7d0,2.5);
  std::__cxx11::string::~string((string *)&local_7d0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_7f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1500,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_7f0,(shared_ptr<RandomUtil::Random> *)&local_1500);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1500._M_refcount);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::string((string *)&local_810,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_810,-2.5);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::string((string *)&local_830,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_830,-0.5);
  std::__cxx11::string::~string((string *)&local_830);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_850,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1510,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_850,(shared_ptr<RandomUtil::Random> *)&local_1510);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1510._M_refcount);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::string((string *)&local_870,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_870,-4.9);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::string((string *)&local_890,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_890,-3.1);
  std::__cxx11::string::~string((string *)&local_890);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_8b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1520,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_8b0,(shared_ptr<RandomUtil::Random> *)&local_1520);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1520._M_refcount);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::string((string *)&local_8d0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_8d0,3.1);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::string((string *)&local_8f0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_8f0,4.9);
  std::__cxx11::string::~string((string *)&local_8f0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_910,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1530,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_910,(shared_ptr<RandomUtil::Random> *)&local_1530);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1530._M_refcount);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::string
            ((string *)&local_930,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_930,0.2);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::string
            ((string *)&local_950,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_950,3.0);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::string((string *)&local_970,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_970,-5.1);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::string((string *)&local_990,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_990,-2.8);
  std::__cxx11::string::~string((string *)&local_990);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_9b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1540,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_9b0,(shared_ptr<RandomUtil::Random> *)&local_1540);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1540._M_refcount);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::string((string *)&local_9d0,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_9d0,2.8);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::string((string *)&local_9f0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_9f0,5.1);
  std::__cxx11::string::~string((string *)&local_9f0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_a10,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1550,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_a10,(shared_ptr<RandomUtil::Random> *)&local_1550);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1550._M_refcount);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::string((string *)&local_a30,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_a30,1.7);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::string((string *)&local_a50,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_a50,3.7);
  std::__cxx11::string::~string((string *)&local_a50);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_a70,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1560,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_a70,(shared_ptr<RandomUtil::Random> *)&local_1560);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1560._M_refcount);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::string((string *)&local_a90,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_a90,-3.7);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::string((string *)&local_ab0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_ab0,-1.7);
  std::__cxx11::string::~string((string *)&local_ab0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_ad0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1570,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_ad0,(shared_ptr<RandomUtil::Random> *)&local_1570);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1570._M_refcount);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::string
            ((string *)&local_af0,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_af0,0.2);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::string
            ((string *)&local_b10,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_b10,2.0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::string((string *)&local_b30,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_b30,-3.9);
  std::__cxx11::string::~string((string *)&local_b30);
  std::__cxx11::string::string((string *)&local_b50,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_b50,-3.1);
  std::__cxx11::string::~string((string *)&local_b50);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_b70,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1580,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_b70,(shared_ptr<RandomUtil::Random> *)&local_1580);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1580._M_refcount);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::string((string *)&local_b90,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_b90,3.1);
  std::__cxx11::string::~string((string *)&local_b90);
  std::__cxx11::string::string((string *)&local_bb0,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_bb0,3.9);
  std::__cxx11::string::~string((string *)&local_bb0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_bd0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1590,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_bd0,(shared_ptr<RandomUtil::Random> *)&local_1590);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1590._M_refcount);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::__cxx11::string::string((string *)&local_bf0,"rap_type",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_bf0,1.0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::string
            ((string *)&local_c10,"rapidity_distribution",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_c10,1.0);
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::string
            ((string *)&local_c30,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_c30,0.2);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::string
            ((string *)&local_c50,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_c50,3.0);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::string((string *)&local_c70,"rap_min",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_c70,-0.5);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::string((string *)&local_c90,"rap_max",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_c90,0.5);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::string((string *)&local_cb0,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_cb0,211.0);
  std::__cxx11::string::~string((string *)&local_cb0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_cd0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_15a0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_cd0,(shared_ptr<RandomUtil::Random> *)&local_15a0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_15a0._M_refcount);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::__cxx11::string::string((string *)&local_cf0,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_cf0,-211.0);
  std::__cxx11::string::~string((string *)&local_cf0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_d10,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_15b0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_d10,(shared_ptr<RandomUtil::Random> *)&local_15b0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_15b0._M_refcount);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::string((string *)&local_d30,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_d30,321.0);
  std::__cxx11::string::~string((string *)&local_d30);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_d50,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_15c0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_d50,(shared_ptr<RandomUtil::Random> *)&local_15c0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_15c0._M_refcount);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::string((string *)&local_d70,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_d70,-321.0);
  std::__cxx11::string::~string((string *)&local_d70);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_d90,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_15d0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_d90,(shared_ptr<RandomUtil::Random> *)&local_15d0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_15d0._M_refcount);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::string((string *)&local_db0,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_db0,2212.0);
  std::__cxx11::string::~string((string *)&local_db0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_dd0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_15e0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_dd0,(shared_ptr<RandomUtil::Random> *)&local_15e0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_15e0._M_refcount);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::string((string *)&local_df0,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_df0,-2212.0);
  std::__cxx11::string::~string((string *)&local_df0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_e10,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_15f0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_e10,(shared_ptr<RandomUtil::Random> *)&local_15f0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_15f0._M_refcount);
  std::__cxx11::string::~string((string *)&local_e10);
  std::__cxx11::string::string
            ((string *)&local_e30,"resonance_weak_feed_down_flag",(allocator *)&local_1760);
  local_1708 = ParameterReader::getVal(&local_1758,&local_e30);
  std::__cxx11::string::~string((string *)&local_e30);
  if ((local_1708 == 0.0) && (!NAN(local_1708))) {
    std::__cxx11::string::string((string *)&local_e50,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_e50,3122.0);
    std::__cxx11::string::~string((string *)&local_e50);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_e70,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1600,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_e70,(shared_ptr<RandomUtil::Random> *)&local_1600);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1600._M_refcount);
    std::__cxx11::string::~string((string *)&local_e70);
    std::__cxx11::string::string((string *)&local_e90,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_e90,-3122.0);
    std::__cxx11::string::~string((string *)&local_e90);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_eb0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1610,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_eb0,(shared_ptr<RandomUtil::Random> *)&local_1610);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1610._M_refcount);
    std::__cxx11::string::~string((string *)&local_eb0);
    std::__cxx11::string::string((string *)&local_ed0,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_ed0,3312.0);
    std::__cxx11::string::~string((string *)&local_ed0);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_ef0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1620,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_ef0,(shared_ptr<RandomUtil::Random> *)&local_1620);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1620._M_refcount);
    std::__cxx11::string::~string((string *)&local_ef0);
    std::__cxx11::string::string((string *)&local_f10,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_f10,-3312.0);
    std::__cxx11::string::~string((string *)&local_f10);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_f30,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1630,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_f30,(shared_ptr<RandomUtil::Random> *)&local_1630);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1630._M_refcount);
    std::__cxx11::string::~string((string *)&local_f30);
    std::__cxx11::string::string((string *)&local_f50,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_f50,3334.0);
    std::__cxx11::string::~string((string *)&local_f50);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_f70,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1640,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_f70,(shared_ptr<RandomUtil::Random> *)&local_1640);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1640._M_refcount);
    std::__cxx11::string::~string((string *)&local_f70);
    std::__cxx11::string::string((string *)&local_f90,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_f90,-3334.0);
    std::__cxx11::string::~string((string *)&local_f90);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_fb0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1650,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_fb0,(shared_ptr<RandomUtil::Random> *)&local_1650);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1650._M_refcount);
    std::__cxx11::string::~string((string *)&local_fb0);
    std::__cxx11::string::string((string *)&local_fd0,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_fd0,333.0);
    std::__cxx11::string::~string((string *)&local_fd0);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_ff0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1660,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_ff0,(shared_ptr<RandomUtil::Random> *)&local_1660);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1660._M_refcount);
    std::__cxx11::string::~string((string *)&local_ff0);
  }
  std::__cxx11::string::string
            ((string *)&local_1010,"collect_neutral_particles",(allocator *)&local_1760);
  local_1708 = ParameterReader::getVal(&local_1758,&local_1010,0.0);
  std::__cxx11::string::~string((string *)&local_1010);
  if ((local_1708 == 1.0) && (!NAN(local_1708))) {
    std::__cxx11::string::string((string *)&local_1030,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1030,111.0);
    std::__cxx11::string::~string((string *)&local_1030);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_1050,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1670,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_1050,(shared_ptr<RandomUtil::Random> *)&local_1670);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1670._M_refcount);
    std::__cxx11::string::~string((string *)&local_1050);
    std::__cxx11::string::string((string *)&local_1070,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1070,311.0);
    std::__cxx11::string::~string((string *)&local_1070);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_1090,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1680,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_1090,(shared_ptr<RandomUtil::Random> *)&local_1680);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1680._M_refcount);
    std::__cxx11::string::~string((string *)&local_1090);
    std::__cxx11::string::string((string *)&local_10b0,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_10b0,-311.0);
    std::__cxx11::string::~string((string *)&local_10b0);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_10d0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1690,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_10d0,(shared_ptr<RandomUtil::Random> *)&local_1690);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1690._M_refcount);
    std::__cxx11::string::~string((string *)&local_10d0);
    std::__cxx11::string::string((string *)&local_10f0,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_10f0,2112.0);
    std::__cxx11::string::~string((string *)&local_10f0);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_1110,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_16a0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_1110,(shared_ptr<RandomUtil::Random> *)&local_16a0);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_16a0._M_refcount);
    std::__cxx11::string::~string((string *)&local_1110);
    std::__cxx11::string::string((string *)&local_1130,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1130,-2112.0);
    std::__cxx11::string::~string((string *)&local_1130);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_1150,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_16b0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_1150,(shared_ptr<RandomUtil::Random> *)&local_16b0);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_16b0._M_refcount);
    std::__cxx11::string::~string((string *)&local_1150);
  }
  std::__cxx11::string::string((string *)&local_1170,"rap_type",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_1170,0.0);
  std::__cxx11::string::~string((string *)&local_1170);
  std::__cxx11::string::string((string *)&local_1190,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_1190,2212.0);
  std::__cxx11::string::~string((string *)&local_1190);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_11b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_16c0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_11b0,(shared_ptr<RandomUtil::Random> *)&local_16c0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_16c0._M_refcount);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::__cxx11::string::string((string *)&local_11d0,"particle_monval",(allocator *)&local_1760);
  ParameterReader::setVal(&local_1758,&local_11d0,-2212.0);
  std::__cxx11::string::~string((string *)&local_11d0);
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_11f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_16d0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
            );
  singleParticleSpectra::singleParticleSpectra
            (psVar5,&local_1758,&local_11f0,(shared_ptr<RandomUtil::Random> *)&local_16d0);
  local_1760 = psVar5;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
             &local_1760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_16d0._M_refcount);
  std::__cxx11::string::~string((string *)&local_11f0);
  if ((int)dVar7 == 1) {
    std::__cxx11::string::string
              ((string *)&local_1210,"compute_correlation",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1210,1.0);
    std::__cxx11::string::~string((string *)&local_1210);
    std::__cxx11::string::string
              ((string *)&local_1230,"flag_charge_dependence",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1230,(double)local_16fc);
    std::__cxx11::string::~string((string *)&local_1230);
    std::__cxx11::string::string((string *)&local_1250,"particle_monval",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1250,9999.0);
    std::__cxx11::string::~string((string *)&local_1250);
    std::__cxx11::string::string((string *)&local_1270,"rap_type",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1270,0.0);
    std::__cxx11::string::~string((string *)&local_1270);
    std::__cxx11::string::string
              ((string *)&local_1290,"compute_corr_rap_dep",(allocator *)&local_1760);
    local_1708 = ParameterReader::getVal(&local_1758,&local_1290);
    std::__cxx11::string::~string((string *)&local_1290);
    if ((local_1708 != 1.0) || (NAN(local_1708))) {
      std::__cxx11::string::string
                ((string *)&local_1330,"rapidity_distribution",(allocator *)&local_1760);
      ParameterReader::setVal(&local_1758,&local_1330,0.0);
      this_00 = &local_1330;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_12b0,"rapidity_distribution",(allocator *)&local_1760);
      ParameterReader::setVal(&local_1758,&local_12b0,1.0);
      std::__cxx11::string::~string((string *)&local_12b0);
      std::__cxx11::string::string
                ((string *)&local_12d0,"rapidity_dis_min",(allocator *)&local_1760);
      ParameterReader::setVal(&local_1758,&local_12d0,-2.0);
      std::__cxx11::string::~string((string *)&local_12d0);
      std::__cxx11::string::string
                ((string *)&local_12f0,"rapidity_dis_max",(allocator *)&local_1760);
      ParameterReader::setVal(&local_1758,&local_12f0,2.0);
      std::__cxx11::string::~string((string *)&local_12f0);
      std::__cxx11::string::string((string *)&local_1310,"n_rap",(allocator *)&local_1760);
      ParameterReader::setVal(&local_1758,&local_1310,41.0);
      this_00 = &local_1310;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string
              ((string *)&local_1350,"vn_rapidity_dis_pT_min",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1350,0.2);
    std::__cxx11::string::~string((string *)&local_1350);
    std::__cxx11::string::string
              ((string *)&local_1370,"vn_rapidity_dis_pT_max",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1370,2.0);
    std::__cxx11::string::~string((string *)&local_1370);
    std::__cxx11::string::string((string *)&local_1390,"rap_min",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1390,-1.0);
    std::__cxx11::string::~string((string *)&local_1390);
    std::__cxx11::string::string((string *)&local_13b0,"rap_max",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_13b0,1.0);
    std::__cxx11::string::~string((string *)&local_13b0);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_13d0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_16e0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_13d0,(shared_ptr<RandomUtil::Random> *)&local_16e0);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_16e0._M_refcount);
    std::__cxx11::string::~string((string *)&local_13d0);
    std::__cxx11::string::string((string *)&local_13f0,"rap_min",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_13f0,-2.0);
    std::__cxx11::string::~string((string *)&local_13f0);
    std::__cxx11::string::string((string *)&local_1410,"rap_max",(allocator *)&local_1760);
    ParameterReader::setVal(&local_1758,&local_1410,2.0);
    std::__cxx11::string::~string((string *)&local_1410);
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_1430,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_16f0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar5,&local_1758,&local_1430,(shared_ptr<RandomUtil::Random> *)&local_16f0);
    local_1760 = psVar5;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1728,
               &local_1760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_16f0._M_refcount);
    std::__cxx11::string::~string((string *)&local_1430);
  }
  psVar2 = &this->particle_list_;
  this_01 = (ostream *)&this->messager;
  local_1708 = 0.0;
  local_16f8 = this_01;
  while (bVar4 = particleSamples::end_of_file
                           ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr),
        ppsVar3 = local_1728._M_impl.super__Vector_impl_data._M_finish,
        ppsVar6 = local_1728._M_impl.super__Vector_impl_data._M_start, !bVar4) {
    std::operator<<(this_01,"Reading event: ");
    std::ostream::operator<<(this_01,SUB84(local_1708,0) + 1);
    std::operator<<(this_01," ... ");
    std::__cxx11::string::string((string *)&local_50,"info",(allocator *)&local_1760);
    pretty_ostream::flush((pretty_ostream *)this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_16fc = particleSamples::read_in_particle_samples
                           ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr);
    std::operator<<(this_01,"nev = ");
    std::ostream::operator<<(this_01,local_16fc);
    std::__cxx11::string::string((string *)&local_70,"info",(allocator *)&local_1760);
    pretty_ostream::flush((pretty_ostream *)this_01,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90," processing ...",(allocator *)&local_1760);
    pretty_ostream::info((pretty_ostream *)this_01,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ppsVar3 = local_1728._M_impl.super__Vector_impl_data._M_finish;
    for (ppsVar6 = local_1728._M_impl.super__Vector_impl_data._M_start; ppsVar6 != ppsVar3;
        ppsVar6 = ppsVar6 + 1) {
      particleSamples::filter_particles_from_events
                ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 (*ppsVar6)->particle_monval);
      psVar5 = *ppsVar6;
      std::__shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1440,
                 &psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>);
      singleParticleSpectra::calculate_Qn_vector_shell
                (psVar5,(shared_ptr<particleSamples> *)&local_1440);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1440._M_refcount);
    }
    std::__cxx11::string::string((string *)&local_b0,"done!",(allocator *)&local_1760);
    this_01 = local_16f8;
    pretty_ostream::info((pretty_ostream *)local_16f8,&local_b0);
    dVar7 = local_1708;
    std::__cxx11::string::~string((string *)&local_b0);
    local_1708 = (double)(ulong)(uint)(local_16fc + SUB84(dVar7,0));
  }
  for (; ppsVar6 != ppsVar3; ppsVar6 = ppsVar6 + 1) {
    singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar6);
  }
  if (local_1728._M_impl.super__Vector_impl_data._M_finish !=
      local_1728._M_impl.super__Vector_impl_data._M_start) {
    local_1728._M_impl.super__Vector_impl_data._M_finish =
         local_1728._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
  ~_Vector_base(&local_1728);
  ParameterReader::~ParameterReader(&local_1758);
  return;
}

Assistant:

void Analysis::FlowAnalysis() {
    ParameterReader paraRdr = paraRdr_;
    int compute_correlation = paraRdr.getVal("compute_correlation");
    if (compute_correlation == 1) paraRdr.setVal("compute_correlation", 0);
    int flag_charge_dependence = paraRdr.getVal("flag_charge_dependence");
    if (flag_charge_dependence == 1)
        paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.15);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR rapidity cut
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE rapidity cut
    paraRdr.setVal("rap_min", -0.8);
    paraRdr.setVal("rap_max", 0.8);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR flow rapidity decorrelation cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.4);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.0);
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // CMS default cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.3);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -2.4);
    paraRdr.setVal("rap_max", 2.4);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS UPC cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.4);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS default cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 5.0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS forward
    paraRdr.setVal("rap_min", -4.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 4.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE V0A
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -5.1);
    paraRdr.setVal("rap_max", -2.8);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 2.8);
    paraRdr.setVal("rap_max", 5.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE V0C
    paraRdr.setVal("rap_min", 1.7);
    paraRdr.setVal("rap_max", 3.7);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -3.7);
    paraRdr.setVal("rap_max", -1.7);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // PHENIX BBC
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    paraRdr.setVal("rap_min", -3.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 3.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    if (paraRdr.getVal("collect_neutral_particles", 0) == 1) {
        paraRdr.setVal("particle_monval", 111);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // lastly, if we want to compute multi-particle correlations within
    // the same UrQMD events
    if (compute_correlation == 1) {
        paraRdr.setVal("compute_correlation", 1);
        paraRdr.setVal("flag_charge_dependence", flag_charge_dependence);
        paraRdr.setVal("particle_monval", 9999);
        paraRdr.setVal("rap_type", 0);
        if (paraRdr.getVal("compute_corr_rap_dep") == 1) {
            // turn on flag to compute the rapidity dependent muti-particle
            // correlations
            paraRdr.setVal("rapidity_distribution", 1);
            paraRdr.setVal("rapidity_dis_min", -2.0);
            paraRdr.setVal("rapidity_dis_max", 2.0);
            paraRdr.setVal("n_rap", 41);
        } else {
            paraRdr.setVal("rapidity_distribution", 0);
        }
        paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
        paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
        paraRdr.setVal("rap_min", -1.0);
        paraRdr.setVal("rap_max", 1.0);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("rap_min", -2.0);
        paraRdr.setVal("rap_max", 2.0);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}